

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

Builder * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcCallContext::getResults
          (Builder *__return_storage_ptr__,RpcCallContext *this,Maybe<capnp::MessageSize> *sizeHint)

{
  uint *puVar1;
  uint uVar2;
  RpcConnectionState *pRVar3;
  undefined8 *puVar4;
  RpcServerResponse *pRVar5;
  OutgoingRpcMessage *pOVar6;
  LocallyRedirectedRpcResponse *this_00;
  SegmentBuilder *pSVar7;
  int iVar8;
  ulong uVar9;
  RpcServerResponse *pRVar10;
  Builder *pBVar11;
  Refcounted *refcounted;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl,_std::nullptr_t> OVar12;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> message;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> local_b8;
  PointerBuilder local_a8;
  undefined1 local_90 [24];
  WirePointer *pWStack_78;
  StructDataBitCount local_70;
  StructPointerCount SStack_6c;
  undefined2 uStack_6a;
  StructBuilder local_68;
  SegmentBuilder *local_38;
  CapTableBuilder *pCStack_30;
  WirePointer *local_28;
  
  pRVar10 = (this->response).ptr.ptr;
  if (pRVar10 == (RpcServerResponse *)0x0) {
    if ((this->redirectResults == false) &&
       (pRVar3 = (this->connectionState).ptr, (pRVar3->connection).tag == 1)) {
      puVar4 = *(undefined8 **)((long)&(pRVar3->connection).field_1 + 0x10);
      iVar8 = 0;
      if ((sizeHint->ptr).isSet == true) {
        uVar2 = (sizeHint->ptr).field_1.value.capCount;
        uVar9 = ((ulong)(uVar2 * 4) + (sizeHint->ptr).field_1.value.wordCount + 1) -
                (ulong)(uVar2 == 0);
        if (0xfffff < uVar9) {
          uVar9 = 0x100000;
        }
        iVar8 = (int)uVar9 + 8;
      }
      (**(code **)*puVar4)(&local_b8,puVar4,iVar8);
      (**(local_b8.ptr)->_vptr_OutgoingRpcMessage)(&local_38);
      local_a8.pointer = local_28;
      local_a8.segment = local_38;
      local_a8.capTable = pCStack_30;
      PointerBuilder::initStruct(&local_68,&local_a8,(StructSize)0x10001);
      *(undefined2 *)&((WireValue<uint32_t>_conflict *)local_68.data)->value = 3;
      local_a8.segment = local_68.segment;
      local_a8.capTable = local_68.capTable;
      local_a8.pointer = local_68.pointers;
      PointerBuilder::initStruct((StructBuilder *)local_90,&local_a8,(StructSize)0x10002);
      (this->returnMessage)._builder.dataSize = local_70;
      (this->returnMessage)._builder.pointerCount = SStack_6c;
      *(undefined2 *)&(this->returnMessage)._builder.field_0x26 = uStack_6a;
      (this->returnMessage)._builder.data = (void *)local_90._16_8_;
      (this->returnMessage)._builder.pointers = pWStack_78;
      (this->returnMessage)._builder.segment =
           (SegmentBuilder *)CONCAT71(local_90._1_7_,local_90[0]);
      (this->returnMessage)._builder.capTable = (CapTableBuilder *)local_90._8_8_;
      pRVar3 = (this->connectionState).ptr;
      local_68.data = (this->returnMessage)._builder.pointers;
      local_68.segment = (this->returnMessage)._builder.segment;
      local_68.capTable = (this->returnMessage)._builder.capTable;
      PointerBuilder::getStruct
                ((StructBuilder *)local_90,(PointerBuilder *)&local_68,(StructSize)0x20000,
                 (word *)0x0);
      OVar12 = kj::
               heap<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl,capnp::_::RpcSystemBase::RpcConnectionState&,kj::Own<capnp::OutgoingRpcMessage,decltype(nullptr)>,capnp::rpc::Payload::Builder>
                         ((kj *)&local_a8,pRVar3,&local_b8,(Builder *)local_90);
      pRVar10 = (RpcServerResponse *)local_a8.capTable;
      pSVar7 = local_a8.segment;
      pOVar6 = local_b8.ptr;
      if (local_b8.ptr != (OutgoingRpcMessage *)0x0) {
        local_b8.ptr = (OutgoingRpcMessage *)0x0;
        (**(local_b8.disposer)->_vptr_Disposer)
                  (local_b8.disposer,
                   pOVar6->_vptr_OutgoingRpcMessage[-2] + (long)&pOVar6->_vptr_OutgoingRpcMessage,
                   OVar12.ptr);
      }
    }
    else {
      this_00 = (LocallyRedirectedRpcResponse *)operator_new(0x110);
      local_90[0] = (sizeHint->ptr).isSet;
      if (local_90[0] == true) {
        local_90._8_8_ = (sizeHint->ptr).field_1.value.wordCount;
        local_90._16_8_ = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
      }
      LocallyRedirectedRpcResponse::LocallyRedirectedRpcResponse
                (this_00,(Maybe<capnp::MessageSize> *)local_90);
      pSVar7 = (SegmentBuilder *)&this_00->super_Refcounted;
      puVar1 = &(this_00->super_Refcounted).refcount;
      *puVar1 = *puVar1 + 1;
      pRVar10 = &this_00->super_RpcServerResponse;
    }
    (**pRVar10->_vptr_RpcServerResponse)(__return_storage_ptr__,pRVar10);
    pBVar11 = (Builder *)(this->response).ptr.disposer;
    pRVar5 = (this->response).ptr.ptr;
    (this->response).ptr.disposer = (Disposer *)pSVar7;
    (this->response).ptr.ptr = pRVar10;
    if (pRVar5 == (RpcServerResponse *)0x0) {
      return __return_storage_ptr__;
    }
    pRVar10 = (RpcServerResponse *)
              (pRVar5->_vptr_RpcServerResponse[-2] + (long)&pRVar5->_vptr_RpcServerResponse);
    pSVar7 = (pBVar11->builder).segment;
  }
  else {
    pSVar7 = (SegmentBuilder *)pRVar10->_vptr_RpcServerResponse;
    pBVar11 = __return_storage_ptr__;
  }
  (*(code *)(pSVar7->super_SegmentReader).arena)(pBVar11,pRVar10);
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Builder getResults(kj::Maybe<MessageSize> sizeHint) override {
      KJ_IF_SOME(r, response) {
        return r->getResultsBuilder();
      } else {
        kj::Own<RpcServerResponse> response;

        if (redirectResults || !connectionState->connection.is<Connected>()) {
          response = kj::refcounted<LocallyRedirectedRpcResponse>(sizeHint);
        } else {
          auto message = connectionState->connection.get<Connected>().connection
              ->newOutgoingMessage(
                  firstSegmentSize(sizeHint, messageSizeHint<rpc::Return>() +
                                  sizeInWords<rpc::Payload>()));
          returnMessage = message->getBody().initAs<rpc::Message>().initReturn();
          response = kj::heap<RpcServerResponseImpl>(
              *connectionState, kj::mv(message), returnMessage.getResults());
        }

        auto results = response->getResultsBuilder();
        this->response = kj::mv(response);
        return results;
      }